

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

string * helics::prettyPrintString_abi_cxx11_(ActionMessage *command)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  bool bVar1;
  action_t aVar2;
  BaseType BVar3;
  BaseType BVar4;
  string *psVar5;
  string *x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ActionMessage *in_RSI;
  string *in_RDI;
  string_view sVar6;
  string *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  int iVar7;
  ActionMessage *in_stack_fffffffffffff898;
  char __c;
  undefined4 in_stack_fffffffffffff8a0;
  action_t in_stack_fffffffffffff8a4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  allocator<char> *in_stack_fffffffffffff8c0;
  char *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  undefined8 in_stack_fffffffffffff8d8;
  BaseType local_6c4;
  char *local_6c0;
  undefined8 local_6b8;
  undefined1 local_6b0 [32];
  double local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  BaseType local_680;
  BaseType local_67c;
  char *local_678;
  undefined8 local_670;
  undefined1 local_668 [36];
  BaseType local_644;
  double local_640;
  double local_638;
  double local_630;
  BaseType local_624;
  char *local_620;
  undefined8 local_618;
  undefined1 local_610 [36];
  BaseType local_5ec;
  double local_5e8;
  BaseType local_5dc;
  char *local_5d8;
  undefined8 local_5d0;
  undefined1 local_5c8 [32];
  string_view local_5a8;
  BaseType local_594;
  double local_590;
  size_t local_588;
  BaseType local_580;
  BaseType local_57c;
  char *local_578;
  undefined8 local_570;
  undefined1 local_568 [64];
  string_view local_528;
  size_t local_518;
  undefined8 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  string_view in_stack_fffffffffffffb00;
  allocator<char> local_4aa;
  undefined1 local_4a9;
  ActionMessage *local_4a8;
  BaseType local_498 [4];
  BaseType local_488 [4];
  size_t local_478 [2];
  double local_468 [2];
  undefined1 local_458 [16];
  undefined8 local_448;
  BaseType *local_440;
  char *local_438;
  undefined8 local_430;
  BaseType *local_428;
  double *local_420;
  size_t *local_418;
  BaseType *local_410;
  BaseType *local_408;
  char *local_400;
  undefined8 local_3f8;
  undefined1 *local_3f0;
  BaseType local_3e8 [4];
  double local_3d8 [2];
  undefined1 local_3c8 [16];
  undefined8 local_3b8;
  BaseType *local_3b0;
  char *local_3a8;
  undefined8 uStack_3a0;
  BaseType *local_398;
  double *local_390;
  BaseType *local_388;
  char *local_380;
  undefined8 uStack_378;
  undefined1 *local_370;
  BaseType local_368 [4];
  double local_358 [2];
  double local_348 [2];
  double local_338 [2];
  undefined1 local_328 [16];
  undefined8 local_318;
  BaseType *local_310;
  char *local_308;
  undefined8 uStack_300;
  BaseType *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  BaseType *local_2d8;
  char *local_2d0;
  undefined8 uStack_2c8;
  undefined1 *local_2c0;
  undefined1 local_2b8 [16];
  BaseType local_2a8 [4];
  BaseType local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278 [2];
  double local_268 [2];
  undefined8 local_258;
  undefined1 *local_250;
  char *local_248;
  undefined8 uStack_240;
  double *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  BaseType *local_218;
  BaseType *local_210;
  string *local_208;
  char *local_200;
  undefined8 uStack_1f8;
  undefined1 *local_1f0;
  BaseType local_1e8 [4];
  undefined8 local_1d8;
  BaseType *local_1d0;
  char *local_1c8;
  undefined8 uStack_1c0;
  BaseType *local_1b0;
  char *local_1a8;
  undefined8 uStack_1a0;
  undefined1 *local_198;
  BaseType local_18c;
  BaseType *local_188;
  BaseType local_17c;
  BaseType *local_178;
  BaseType local_16c;
  BaseType *local_168;
  undefined1 *local_158;
  BaseType local_14c;
  BaseType *local_148;
  undefined1 *local_138;
  BaseType local_12c;
  BaseType *local_128;
  undefined1 *local_118;
  BaseType local_10c;
  BaseType *local_108;
  BaseType local_fc;
  BaseType *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_e8;
  size_t local_e0;
  size_t *local_d8;
  double local_d0;
  double *local_c8;
  double local_c0;
  double *local_b8;
  double local_b0;
  double *local_a8;
  double local_a0;
  double *local_98;
  double local_90;
  double *local_88;
  double local_80;
  double *local_78;
  BaseType *local_70;
  undefined8 *local_68;
  size_t local_60;
  size_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_48;
  BaseType *local_40;
  undefined8 *local_38;
  BaseType *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  BaseType *local_10;
  undefined8 *local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  local_4a9 = 0;
  local_4a8 = in_RSI;
  ActionMessage::action(in_RSI);
  actionMessageType(in_stack_fffffffffffff8a4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),in_stack_fffffffffffff8c8
             ,in_stack_fffffffffffff8c0);
  std::allocator<char>::~allocator(&local_4aa);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff890);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
             (char *)in_stack_fffffffffffff898);
  __x._M_len._4_4_ = in_stack_fffffffffffff8bc;
  __x._M_len._0_4_ = in_stack_fffffffffffff8b8;
  __x._M_str = (char *)in_stack_fffffffffffff8c0;
  __y._M_str._0_4_ = in_stack_fffffffffffff8b0;
  __y._M_len = (size_t)in_stack_fffffffffffff8a8;
  __y._M_str._4_4_ = in_stack_fffffffffffff8b4;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
               (char)((ulong)in_stack_fffffffffffff898 >> 0x38));
    ActionMessage::action(local_4a8);
    std::__cxx11::to_string(iVar7);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff890);
  }
  else {
    aVar2 = ActionMessage::action(local_4a8);
    __c = (char)((ulong)in_stack_fffffffffffff898 >> 0x38);
    if (aVar2 == cmd_reg_broker) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),__c);
      local_5a8 = ActionMessage::name((ActionMessage *)0x5ede7a);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                 in_stack_fffffffffffff8a8);
    }
    else if (aVar2 == cmd_reg_fed) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),__c);
      sVar6 = ActionMessage::name((ActionMessage *)0x5ed98b);
      local_518 = sVar6._M_len;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                 in_stack_fffffffffffff8a8);
    }
    else if (aVar2 == cmd_fed_ack) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),__c);
      local_528 = ActionMessage::name((ActionMessage *)0x5ed9f4);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                 in_stack_fffffffffffff8a8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (char *)in_stack_fffffffffffff898);
      bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_4a8,error_flag);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (char *)in_stack_fffffffffffff898);
      }
      else {
        GlobalFederateId::baseValue(&local_4a8->dest_id);
        std::__cxx11::to_string(iVar7);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff898);
        std::__cxx11::string::~string(in_stack_fffffffffffff890);
      }
    }
    else if (aVar2 == cmd_time_grant) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),__c);
      local_5d8 = "From ({}) Granted Time({}) to ({})";
      local_5d0 = 0x22;
      local_5dc = GlobalFederateId::baseValue(&local_4a8->source_id);
      local_5e8 = TimeRepresentation::operator_cast_to_double
                            ((TimeRepresentation<count_time<9,_long>_> *)0x5edf1e);
      local_5ec = GlobalFederateId::baseValue(&local_4a8->dest_id);
      local_370 = local_5c8;
      local_380 = local_5d8;
      uStack_378 = local_5d0;
      local_388 = &local_5dc;
      local_390 = &local_5e8;
      local_398 = &local_5ec;
      local_3a8 = local_5d8;
      uStack_3a0 = local_5d0;
      local_12c = local_5dc;
      local_128 = local_3e8;
      local_3e8[0] = local_5dc;
      local_88 = local_3d8;
      local_90 = local_5e8;
      local_138 = local_3c8;
      local_38 = &local_3b8;
      local_3b8 = 0x1a1;
      args_00.field_1._0_4_ = in_stack_fffffffffffffaf8;
      args_00.desc_ = in_stack_fffffffffffffaf0;
      args_00.field_1._4_4_ = in_stack_fffffffffffffafc;
      local_40 = local_128;
      local_3d8[0] = local_90;
      local_3b0 = local_128;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb00,args_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff898);
      std::__cxx11::string::~string(in_stack_fffffffffffff890);
    }
    else if (aVar2 == cmd_pub) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),__c);
      local_578 = "From ({}) handle({}) size {} at {} to {}";
      local_570 = 0x28;
      local_57c = GlobalFederateId::baseValue(&local_4a8->source_id);
      local_580 = InterfaceHandle::baseValue(&local_4a8->dest_handle);
      local_588 = SmallBuffer::size(&local_4a8->payload);
      local_590 = TimeRepresentation::operator_cast_to_double
                            ((TimeRepresentation<count_time<9,_long>_> *)0x5edba5);
      local_594 = GlobalFederateId::baseValue(&local_4a8->dest_id);
      local_3f0 = local_568;
      local_400 = local_578;
      local_3f8 = local_570;
      local_408 = &local_57c;
      local_410 = &local_580;
      local_418 = &local_588;
      local_420 = &local_590;
      local_428 = &local_594;
      local_438 = local_578;
      local_430 = local_570;
      local_fc = local_57c;
      local_f8 = local_498;
      local_498[0] = local_57c;
      local_108 = local_488;
      local_10c = local_580;
      local_d8 = local_478;
      local_e0 = local_588;
      local_78 = local_468;
      local_80 = local_590;
      local_118 = local_458;
      local_68 = &local_448;
      local_70 = local_498;
      local_448 = 0x1a411;
      args.field_1._0_4_ = in_stack_fffffffffffffaf8;
      args.desc_ = in_stack_fffffffffffffaf0;
      args.field_1._4_4_ = in_stack_fffffffffffffafc;
      local_60 = local_e0;
      local_58 = local_d8;
      local_488[0] = local_10c;
      local_478[0] = local_e0;
      local_468[0] = local_80;
      local_440 = local_70;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb00,args);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff898);
      std::__cxx11::string::~string(in_stack_fffffffffffff890);
    }
    else if (2 < (uint)(aVar2 + 0xffffff36)) {
      if (aVar2 == cmd_time_request) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),__c);
        local_620 = "From ({}) Time({}, {}, {}) to ({})";
        local_618 = 0x22;
        local_624 = GlobalFederateId::baseValue(&local_4a8->source_id);
        local_630 = TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x5ee164);
        local_638 = TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x5ee17e);
        local_640 = TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x5ee198);
        local_644 = GlobalFederateId::baseValue(&local_4a8->dest_id);
        local_2c0 = local_610;
        local_2d0 = local_620;
        uStack_2c8 = local_618;
        local_2d8 = &local_624;
        local_2e0 = &local_630;
        local_2e8 = &local_638;
        local_2f0 = &local_640;
        local_2f8 = &local_644;
        local_308 = local_620;
        uStack_300 = local_618;
        local_14c = local_624;
        local_148 = local_368;
        local_368[0] = local_624;
        local_98 = local_358;
        local_a0 = local_630;
        local_a8 = local_348;
        local_b0 = local_638;
        local_b8 = local_338;
        local_c0 = local_640;
        local_158 = local_328;
        local_28 = &local_318;
        local_318 = 0x1aaa1;
        args_01.field_1._0_4_ = in_stack_fffffffffffffaf8;
        args_01.desc_ = in_stack_fffffffffffffaf0;
        args_01.field_1._4_4_ = in_stack_fffffffffffffafc;
        local_30 = local_148;
        local_358[0] = local_a0;
        local_348[0] = local_b0;
        local_338[0] = local_c0;
        local_310 = local_148;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb00,args_01);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff898);
        std::__cxx11::string::~string(in_stack_fffffffffffff890);
      }
      else if (aVar2 == cmd_send_message) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),__c);
        local_678 = "From ({})({}:{}) To {} size {} at {}";
        local_670 = 0x24;
        iVar7 = (int)((ulong)in_stack_fffffffffffff890 >> 0x20);
        psVar5 = ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffff898,iVar7);
        BVar3 = GlobalFederateId::baseValue(&local_4a8->source_id);
        local_67c = BVar3;
        BVar4 = InterfaceHandle::baseValue(&local_4a8->source_handle);
        local_680 = BVar4;
        x = ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffff898,iVar7);
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               SmallBuffer::size(&local_4a8->payload);
        local_688 = this;
        local_690 = TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x5ee4ed);
        local_1f0 = local_668;
        local_200 = local_678;
        uStack_1f8 = local_670;
        local_210 = &local_67c;
        local_218 = &local_680;
        local_228 = &local_688;
        local_230 = &local_690;
        local_248 = local_678;
        uStack_240 = local_670;
        local_220 = x;
        local_208 = psVar5;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)CONCAT44(BVar3,BVar4),x);
        local_168 = local_2a8;
        local_16c = *local_210;
        local_178 = local_298;
        local_17c = *local_218;
        local_2a8[0] = local_16c;
        local_298[0] = local_17c;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)CONCAT44(BVar3,BVar4),x);
        local_e8 = local_278;
        local_f0 = *local_228;
        local_c8 = local_268;
        local_d0 = *local_230;
        local_18 = &local_258;
        local_20 = local_2b8;
        local_258 = 0xa4d11d;
        args_02.field_1._0_4_ = in_stack_fffffffffffffaf8;
        args_02.desc_ = in_stack_fffffffffffffaf0;
        args_02.field_1._4_4_ = in_stack_fffffffffffffafc;
        local_50 = local_f0;
        local_48 = local_e8;
        local_278[0] = local_f0;
        local_268[0] = local_d0;
        local_250 = local_20;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb00,args_02);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(BVar3,BVar4),x);
        std::__cxx11::string::~string(this);
      }
      else {
        local_6c0 = ":From {}";
        local_6b8 = 8;
        local_6c4 = GlobalFederateId::baseValue(&local_4a8->source_id);
        local_198 = local_6b0;
        local_1a8 = local_6c0;
        uStack_1a0 = local_6b8;
        local_1b0 = &local_6c4;
        local_1c8 = local_6c0;
        uStack_1c0 = local_6b8;
        local_188 = local_1e8;
        local_8 = &local_1d8;
        local_1d8 = 1;
        args_03.field_1._0_4_ = in_stack_fffffffffffffaf8;
        args_03.desc_ = in_stack_fffffffffffffaf0;
        args_03.field_1._4_4_ = in_stack_fffffffffffffafc;
        local_18c = local_6c4;
        local_10 = local_188;
        local_1e8[0] = local_6c4;
        local_1d0 = local_188;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb00,args_03);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff898);
        std::__cxx11::string::~string(in_stack_fffffffffffff890);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string prettyPrintString(const ActionMessage& command)
{
    std::string ret{actionMessageType(command.action())};
    if (std::string_view{ret} == std::string_view{unknownStr}) {
        ret.push_back(' ');
        ret.append(std::to_string(static_cast<int>(command.action())));
        return ret;
    }
    switch (command.action()) {
        case CMD_REG_FED:
            ret.push_back(':');
            ret.append(command.name());
            break;
        case CMD_FED_ACK:
            ret.push_back(':');
            ret.append(command.name());
            ret.append("--");
            if (checkActionFlag(command, error_flag)) {
                ret.append("error");
            } else {
                ret.append(std::to_string(command.dest_id.baseValue()));
            }
            break;
        case CMD_PUB:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) handle({}) size {} at {} to {}",
                                   command.source_id.baseValue(),
                                   command.dest_handle.baseValue(),
                                   command.payload.size(),
                                   static_cast<double>(command.actionTime),
                                   command.dest_id.baseValue()));
            break;
        case CMD_REG_BROKER:
            ret.push_back(':');
            ret.append(command.name());
            break;
        case CMD_TIME_GRANT:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) Granted Time({}) to ({})",
                                   command.source_id.baseValue(),
                                   static_cast<double>(command.actionTime),
                                   command.dest_id.baseValue()));
            break;
        case CMD_TIME_REQUEST:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) Time({}, {}, {}) to ({})",
                                   command.source_id.baseValue(),
                                   static_cast<double>(command.actionTime),
                                   static_cast<double>(command.Te),
                                   static_cast<double>(command.Tdemin),
                                   command.dest_id.baseValue()));
            break;
        case CMD_FED_CONFIGURE_TIME:
        case CMD_FED_CONFIGURE_INT:
        case CMD_FED_CONFIGURE_FLAG:
            break;
        case CMD_SEND_MESSAGE:
            ret.push_back(':');
            ret.append(fmt::format("From ({})({}:{}) To {} size {} at {}",
                                   command.getString(origSourceStringLoc),
                                   command.source_id.baseValue(),
                                   command.source_handle.baseValue(),
                                   command.getString(targetStringLoc),
                                   command.payload.size(),
                                   static_cast<double>(command.actionTime)));
            break;
        default:
            ret.append(fmt::format(":From {}", command.source_id.baseValue()));
            break;
    }
    return ret;
}